

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O0

void anon_unknown.dwarf_23de0c::PulsePlayback::sinkInfoCallbackC
               (pa_context *context,pa_sink_info *info,int eol,void *pdata)

{
  int in_stack_0000017c;
  pa_sink_info *in_stack_00000180;
  pa_context *in_stack_00000188;
  PulsePlayback *in_stack_00000190;
  
  sinkInfoCallback(in_stack_00000190,in_stack_00000188,in_stack_00000180,in_stack_0000017c);
  return;
}

Assistant:

static void sinkInfoCallbackC(pa_context *context, const pa_sink_info *info, int eol, void *pdata) noexcept
    { static_cast<PulsePlayback*>(pdata)->sinkInfoCallback(context, info, eol); }